

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_776f::VECTOR_FLATTEN_DIM_3_Test::TestBody(VECTOR_FLATTEN_DIM_3_Test *this)

{
  long lVar1;
  char *pcVar2;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_04;
  initializer_list<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  __l_05;
  initializer_list<int> __l_06;
  allocator_type local_11f;
  allocator_type local_11e;
  allocator_type local_11d;
  allocator_type local_11c;
  allocator_type local_11b;
  allocator_type local_11a;
  allocator_type local_119;
  AssertionResult gtest_ar_1;
  _Vector_base<int,_std::allocator<int>_> local_108;
  vector<int,_std::allocator<int>_> local_f0;
  AssertionResult gtest_ar;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  vStack_c0;
  vector<int,_std::allocator<int>_> res;
  vector<int,_std::allocator<int>_> local_88;
  int local_6c;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_68;
  type v;
  undefined8 local_34;
  undefined4 local_2c;
  int local_28 [2];
  
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_7_ = 0x2000000;
  gtest_ar_1.message_.ptr_._0_4_ = 3;
  __l._M_len = 3;
  __l._M_array = (iterator)&gtest_ar_1;
  std::vector<int,_std::allocator<int>_>::vector(&res,__l,&local_119);
  local_28[0] = 4;
  local_28[1] = 5;
  __l_00._M_len = 2;
  __l_00._M_array = local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_88,__l_00,&local_11a);
  __l_01._M_len = 2;
  __l_01._M_array = &res;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&gtest_ar,__l_01,&local_11b);
  local_34 = 0x700000006;
  local_2c = 8;
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&local_34;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_108,__l_02,&local_11c);
  local_6c = 9;
  __l_03._M_len = 1;
  __l_03._M_array = &local_6c;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_03,&local_11d);
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&local_108;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&vStack_c0,__l_04,&local_11e);
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&gtest_ar;
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector(&v,__l_05,&local_11f);
  lVar1 = 0x18;
  do {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x18;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)
               ((long)&local_108._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x18;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)
               ((long)&res.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector(&local_68,&v);
  dnet::data_types::vec_flater<int,_3U>::flatten(&res,&local_68);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector(&local_68);
  local_108._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)res.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)res.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2);
  gtest_ar_1._0_4_ = 9;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"res.size()","9",(unsigned_long *)&local_108,(int *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_108);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_108);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  vStack_c0.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x800000007;
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0x2000000;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000003;
  vStack_c0.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 9;
  __l_06._M_len = 9;
  __l_06._M_array = (iterator)&gtest_ar;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_108,__l_06,(allocator_type *)&local_34);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((internal *)&gtest_ar_1,"res","vector<int>({1,2,3,4,5,6,7,8,9})",&res,
             (vector<int,_std::allocator<int>_> *)&local_108);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_108);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((undefined8 *)CONCAT44(gtest_ar_1.message_.ptr_._4_4_,gtest_ar_1.message_.ptr_._0_4_) ==
        (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT44(gtest_ar_1.message_.ptr_._4_4_,gtest_ar_1.message_.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&res.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector(&v);
  return;
}

Assistant:

TEST(VECTOR_FLATTEN, DIM_3) {
        vector_dim<int, 3>::type v = {
                {
                        {1,2,3},
                        {4,5}
                },
                {
                        {6,7,8},
                        {9}
                }
        };
        vector<int> res = vec_flater<int, 3>::flatten(v);
        EXPECT_EQ(res.size(), 9);
        EXPECT_EQ(res, vector<int>({1,2,3,4,5,6,7,8,9}));
    }